

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall UtilTest_Increment_Test::TestBody(UtilTest_Increment_Test *this)

{
  AssertHelper AVar1;
  undefined1 uVar2;
  bool bVar3;
  undefined1 uVar4;
  char *pcVar5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char s [10];
  AssertHelper *in_stack_fffffffffffffee0;
  AssertHelper *this_00;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined8 in_stack_fffffffffffffef8;
  int line;
  char *in_stack_ffffffffffffff00;
  AssertHelper *file;
  undefined8 in_stack_ffffffffffffff08;
  Type TVar6;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  AssertHelper *actual;
  AssertionResult *this_02;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  Message *in_stack_ffffffffffffff58;
  AssertHelper *in_stack_ffffffffffffff60;
  AssertionResult local_98 [2];
  AssertionResult local_78 [2];
  AssertionResult local_58 [3];
  AssertionResult local_28;
  AssertHelper local_18;
  undefined2 local_10;
  
  line = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  TVar6 = (Type)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_10 = 0;
  local_18.data_ = (AssertHelperData *)0x333231;
  actual = &local_18;
  increment((char *)in_stack_fffffffffffffee0);
  this_02 = &local_28;
  testing::internal::CmpHelperSTREQ
            ((char *)in_stack_ffffffffffffff58,
             (char *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             &this_02->success_,(char *)actual);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!(bool)uVar2) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    testing::AssertionResult::failure_message((AssertionResult *)0x1217b7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),TVar6,
               in_stack_ffffffffffffff00,line,
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0x121814);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x121869);
  local_18.data_._2_1_ = 0x38;
  increment((char *)in_stack_fffffffffffffee0);
  testing::internal::CmpHelperSTREQ
            ((char *)in_stack_ffffffffffffff58,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
             &this_02->success_,(char *)actual);
  bVar3 = testing::AssertionResult::operator_cast_to_bool(local_58);
  if (!bVar3) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    testing::AssertionResult::failure_message((AssertionResult *)0x121915);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),TVar6,
               in_stack_ffffffffffffff00,line,
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0x121972);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1219c7);
  file = &local_18;
  increment((char *)in_stack_fffffffffffffee0);
  this_01 = local_78;
  testing::internal::CmpHelperSTREQ
            ((char *)in_stack_ffffffffffffff58,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
             &this_02->success_,(char *)actual);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(this_01);
  TVar6 = (Type)((ulong)this_01 >> 0x20);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_ffffffffffffff10));
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x121a6b);
    line = (int)((ulong)pcVar5 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_ffffffffffffff10),TVar6,(char *)file,line,
               (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0x121ac8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x121b1d);
  AVar1.data_ = local_18.data_;
  local_18.data_._0_3_ = 0x390000;
  local_18.data_._0_1_ = SUB81(AVar1.data_,0);
  local_18.data_._1_1_ = 0x39;
  this_00 = &local_18;
  increment((char *)this_00);
  testing::internal::CmpHelperSTREQ
            ((char *)in_stack_ffffffffffffff58,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
             &this_02->success_,(char *)actual);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_98);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar4,in_stack_ffffffffffffff10));
    testing::AssertionResult::failure_message((AssertionResult *)0x121bd1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_ffffffffffffff10),TVar6,(char *)file,line,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffef0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x121c2c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x121c81);
  return;
}

Assistant:

TEST(UtilTest, Increment) {
  char s[10] = "123";
  increment(s);
  EXPECT_STREQ("124", s);
  s[2] = '8';
  increment(s);
  EXPECT_STREQ("129", s);
  increment(s);
  EXPECT_STREQ("130", s);
  s[1] = s[2] = '9';
  increment(s);
  EXPECT_STREQ("200", s);
}